

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_orientation_string(int ii)

{
  char *pcStack_10;
  int ii_local;
  
  switch(ii) {
  case 1:
    pcStack_10 = "Left-to-Right";
    break;
  case 2:
    pcStack_10 = "Right-to-Left";
    break;
  case 3:
    pcStack_10 = "Posterior-to-Anterior";
    break;
  case 4:
    pcStack_10 = "Anterior-to-Posterior";
    break;
  case 5:
    pcStack_10 = "Inferior-to-Superior";
    break;
  case 6:
    pcStack_10 = "Superior-to-Inferior";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

char const *nifti_orientation_string( int ii )
{
   switch( ii ){
     case NIFTI_L2R: return "Left-to-Right" ;
     case NIFTI_R2L: return "Right-to-Left" ;
     case NIFTI_P2A: return "Posterior-to-Anterior" ;
     case NIFTI_A2P: return "Anterior-to-Posterior" ;
     case NIFTI_I2S: return "Inferior-to-Superior" ;
     case NIFTI_S2I: return "Superior-to-Inferior" ;
   }
   return "Unknown" ;
}